

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hcompress.c
# Opt level: O0

int fits_hcompress(int *a,int ny,int nx,int scale,char *output,long *nbytes,int *status)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  long *in_R9;
  int stat;
  undefined4 in_stack_00000018;
  int in_stack_00000050;
  int in_stack_00000054;
  int *in_stack_00000058;
  undefined4 local_4;
  
  if ((int)*nbytes < 1) {
    iVar1 = htrans(in_stack_00000058,in_stack_00000054,in_stack_00000050);
    if (iVar1 == 0) {
      digitize(in_RDI,in_EDX,in_ESI,in_ECX);
      noutmax = *in_R9;
      *in_R9 = 0;
      iVar1 = encode((char *)a,(long *)CONCAT44(ny,nx),(int *)CONCAT44(scale,in_stack_00000018),
                     output._4_4_,(int)output,nbytes._4_4_);
      *(int *)nbytes = iVar1;
      local_4 = (int)*nbytes;
    }
    else {
      *(int *)nbytes = iVar1;
      local_4 = (int)*nbytes;
    }
  }
  else {
    local_4 = (int)*nbytes;
  }
  return local_4;
}

Assistant:

int fits_hcompress(int *a, int ny, int nx, int scale, char *output, 
                  long *nbytes, int *status)
{
  /* 
     compress the input image using the H-compress algorithm
  
   a  - input image array
   nx - size of X axis of image
   ny - size of Y axis of image
   scale - quantization scale factor. Larger values results in more (lossy) compression
           scale = 0 does lossless compression
   output - pre-allocated array to hold the output compressed stream of bytes
   nbyts  - input value = size of the output buffer;
            returned value = size of the compressed byte stream, in bytes

 NOTE: the nx and ny dimensions as defined within this code are reversed from
 the usual FITS notation.  ny is the fastest varying dimension, which is
 usually considered the X axis in the FITS image display

  */

  int stat;
  
  if (*status > 0) return(*status);

  /* H-transform */
  stat = htrans(a, nx, ny);
  if (stat) {
     *status = stat;
     return(*status);
  }

  /* digitize */
  digitize(a, nx, ny, scale);

  /* encode and write to output array */

  FFLOCK;
  noutmax = *nbytes;  /* input value is the allocated size of the array */
  *nbytes = 0;  /* reset */

  stat = encode(output, nbytes, a, nx, ny, scale);
  FFUNLOCK;
  
  *status = stat;
  return(*status);
}